

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::DOMEntityReferenceImpl
          (DOMEntityReferenceImpl *this,DOMDocument *ownerDoc,XMLCh *entityName)

{
  int iVar1;
  XMLCh *pXVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  long *plVar4;
  DOMNode *pDVar5;
  
  (this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMEntityReferenceImpl_003fdd78;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_003fdf00;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_003fdf30;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_003fdf60;
  pDVar5 = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    pDVar5 = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,pDVar5);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  this->fBaseURI = (XMLCh *)0x0;
  pXVar2 = DOMDocumentImpl::getPooledString
                     ((DOMDocumentImpl *)&(this->fParent).fOwnerDocument[-1].super_DOMNode,
                      entityName);
  this->fName = pXVar2;
  if (ownerDoc != (DOMDocument *)0x0) {
    iVar1 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x148))
                        ((long *)CONCAT44(extraout_var_00,iVar1));
      if (lVar3 != 0) {
        iVar1 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(ownerDoc);
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x148))
                                   ((long *)CONCAT44(extraout_var_01,iVar1));
        plVar4 = (long *)(**(code **)(*plVar4 + 0x20))(plVar4,entityName);
        if (plVar4 != (long *)0x0) {
          pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0xf8))(plVar4);
          this->fBaseURI = pXVar2;
          pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x1b0))(plVar4);
          if (pDVar5 != (DOMNode *)0x0) {
            DOMParentNode::cloneChildren(&this->fParent,pDVar5);
          }
        }
      }
    }
  }
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityReferenceImpl::DOMEntityReferenceImpl(DOMDocument *ownerDoc,
                                         const XMLCh *entityName)
    : fNode(this, ownerDoc), fParent(this, ownerDoc), fBaseURI(0)
{
    fName = ((DOMDocumentImpl*)fParent.fOwnerDocument)->getPooledString(entityName);
    // EntityReference behaves as a read-only node, since its contents
    // reflect the Entity it refers to -- but see setNodeName().
    //retrieve the corresponding entity content

    if (ownerDoc) {
        if (ownerDoc->getDoctype()) {
            if (ownerDoc->getDoctype()->getEntities()) {
                DOMEntityImpl* entity = (DOMEntityImpl*)ownerDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                if (entity) {
                    fBaseURI = entity->getBaseURI();
                    DOMEntityReference* refEntity = entity->getEntityRef();
                    if (refEntity) {
                        fParent.cloneChildren(refEntity);
                    }
                }
            }
        }
    }

    fNode.setReadOnly(true, true);
}